

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O2

bool __thiscall re2c::Spec::add_def(Spec *this,RuleOp *r)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  key_type local_24;
  
  rule_rank_t::def();
  iVar2 = std::
          _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
          ::find(&(this->rules)._M_t,&local_24);
  p_Var1 = &(this->rules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
    add(this,r);
  }
  return (_Rb_tree_header *)iVar2._M_node == p_Var1;
}

Assistant:

bool add_def (RuleOp * r)
	{
		if (rules.find (rule_rank_t::def ()) != rules.end ())
		{
			return false;
		}
		else
		{
			add (r);
			return true;
		}
	}